

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

int mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::del_attr
              (MPI_Datatype param_1,int param_2,void *attribute_val,void *param_4)

{
  if (attribute_val != (void *)0x0) {
    if (*(code **)((long)attribute_val + 0x10) != (code *)0x0) {
      (**(code **)((long)attribute_val + 0x10))(attribute_val,attribute_val,3);
    }
    operator_delete(attribute_val);
  }
  return 0;
}

Assistant:

static int del_attr(MPI_Datatype, int, void *attribute_val, void *) {
        delete (T*)attribute_val;
        return MPI_SUCCESS;
    }